

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O1

string * duckdb::KeywordHelper::WriteQuoted(string *__return_storage_ptr__,string *text,char quote)

{
  ulong *puVar1;
  size_type *psVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct((ulong)&local_48,'\x01');
  EscapeQuotes(&local_68,text,quote);
  uVar5 = 0xf;
  if (local_48 != local_38) {
    uVar5 = local_38[0];
  }
  if (uVar5 < local_68._M_string_length + local_40) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar4 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar4 < local_68._M_string_length + local_40) goto LAB_00d2227b;
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_00d2227b:
    puVar3 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
  }
  local_a8 = &local_98;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_98 = *puVar1;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *puVar1;
    local_a8 = (ulong *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
  uVar5 = 0xf;
  if (local_a8 != &local_98) {
    uVar5 = local_98;
  }
  if (uVar5 < (ulong)(local_80 + local_a0)) {
    uVar5 = 0xf;
    if (local_88 != local_78) {
      uVar5 = local_78[0];
    }
    if ((ulong)(local_80 + local_a0) <= uVar5) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00d2235b;
    }
  }
  puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_00d2235b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar2) {
    uVar4 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar2;
  puVar3[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string KeywordHelper::WriteQuoted(const string &text, char quote) {
	// 1. Escapes all occurences of 'quote' by doubling them (escape in SQL)
	// 2. Adds quotes around the string
	return string(1, quote) + EscapeQuotes(text, quote) + string(1, quote);
}